

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf8_checker.c
# Opt level: O0

void test_utf8(void)

{
  uint8_t *string;
  uint8_t uVar1;
  size_t count;
  uint8_t result;
  test_entry entry;
  cio_utf8_state state;
  uint i;
  test_entry entries [11];
  
  memcpy(&stack0xffffffffffffff48,&PTR_anon_var_dwarf_a1_00107d20,0xb0);
  entry._12_4_ = 0;
  while( true ) {
    if (10 < (uint)entry._12_4_) {
      return;
    }
    cio_utf8_init((cio_utf8_state *)&entry.field_0xa);
    string = *(uint8_t **)(&stack0xffffffffffffff48 + (ulong)(uint)entry._12_4_ * 0x10);
    entry.test_pattern = entries[(uint)entry._12_4_].test_pattern;
    count = strlen((char *)string);
    uVar1 = cio_check_utf8((cio_utf8_state *)&entry.field_0xa,string,count);
    if (uVar1 != (uint8_t)entry.test_pattern) break;
    entry._12_4_ = entry._12_4_ + 1;
  }
  UnityFail("Test pattern not checked successfully!",0x4d);
}

Assistant:

static void test_utf8(void)
{
	struct test_entry entries[] = {
	    {.test_pattern = (const uint8_t *)"\xe7\xae\x80\xe4\xbd\x93\xe4\xb8\xad\xe6\x96\x87\x00", .valid = CIO_UTF8_ACCEPT},
	    {.test_pattern = (const uint8_t *)"Hello\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello123\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello1234\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12345\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello123456\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello1234567\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12345678\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"H", .valid = CIO_UTF8_ACCEPT},
	    {.test_pattern = (const uint8_t *)"\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT}};

	for (unsigned int i = 0; i < ARRAY_SIZE(entries); i++) {
		struct cio_utf8_state state;
		cio_utf8_init(&state);
		struct test_entry entry = entries[i];
		uint8_t result = cio_check_utf8(&state, entry.test_pattern, strlen((const char *)entry.test_pattern));
		TEST_ASSERT_MESSAGE(result == entry.valid, "Test pattern not checked successfully!");
	}
}